

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executable.cpp
# Opt level: O2

addr_type __thiscall Executable::detectAddrType(Executable *this,offset_t offset,addr_type hintType)

{
  addr_type aVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (hintType == RAW) {
    aVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])(this,offset,1);
    aVar1 = aVar1 & 0xff;
  }
  else {
    uVar3 = 2;
    if (hintType != NOT_ADDR) {
      uVar3 = (ulong)hintType;
    }
    iVar2 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])(this,offset,uVar3);
    uVar4 = (ulong)((int)uVar3 == 2 | 2);
    if ((char)iVar2 != '\0') {
      uVar4 = uVar3;
    }
    iVar2 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])(this,offset,uVar4);
    aVar1 = NOT_ADDR;
    if ((char)iVar2 != '\0') {
      aVar1 = (addr_type)uVar4;
    }
  }
  return aVar1;
}

Assistant:

Executable::addr_type Executable::detectAddrType(offset_t offset, Executable::addr_type hintType)
{
    if (hintType == Executable::RAW) {
        if (this->isValidAddr(offset, hintType) == false) {
            return Executable::NOT_ADDR;
        } else return hintType; // it is RAW
    }

    if (hintType == Executable::NOT_ADDR) {
        hintType = Executable::RVA; // check RVA by default
    }
    if (this->isValidAddr(offset, hintType) == false) {
        if (hintType == Executable::RVA) {
            hintType = Executable::VA; // if not RVA, try VA
        } else {
            hintType = Executable::RVA; // if not VA, try RVA
        }
    }
    if (this->isValidAddr(offset, hintType) == false) {
        return Executable::NOT_ADDR; //every attempt failed! it's invalid!
    }
    return hintType;
}